

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

XYZStep IdxToXYZStep(int xyz)

{
  int xyz_local;
  undefined4 local_4;
  
  if (xyz == 0) {
    local_4 = STEP_X;
  }
  else if (xyz == 1) {
    local_4 = STEP_Y;
  }
  else {
    local_4 = STEP_Z;
  }
  return local_4;
}

Assistant:

inline XYZStep IdxToXYZStep(int xyz)
{
    if(xyz == 0)
        return XYZStep::STEP_X;
    else if(xyz == 1)
        return XYZStep::STEP_Y;
    else
        return XYZStep::STEP_Z;
}